

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O1

bool __thiscall EncodedS2LaxPolygonShape::Init(EncodedS2LaxPolygonShape *this,Decoder *decoder)

{
  uchar uVar1;
  uchar *puVar2;
  uchar *puVar3;
  bool bVar4;
  uint uVar5;
  uchar *puVar7;
  S2LogMessage local_20;
  uchar *puVar6;
  
  puVar2 = decoder->buf_;
  puVar3 = decoder->limit_;
  if (puVar3 < puVar2) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
               ,0x1a1,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_20.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
    abort();
  }
  if (puVar3 == puVar2) {
    return false;
  }
  uVar1 = *puVar2;
  puVar6 = puVar2 + 1;
  decoder->buf_ = puVar6;
  if (uVar1 != '\x01') {
    return false;
  }
  if (puVar6 < puVar3) {
    uVar5 = puVar2[1] & 0x7f;
    puVar6 = (uchar *)(ulong)uVar5;
    puVar7 = puVar2 + 2;
    if (-1 < (char)puVar2[1]) goto LAB_001fc1f0;
    if (puVar2 + 2 < puVar3) {
      uVar5 = uVar5 | (puVar2[2] & 0x7f) << 7;
      puVar6 = (uchar *)(ulong)uVar5;
      puVar7 = puVar2 + 3;
      if (-1 < (char)puVar2[2]) goto LAB_001fc1f0;
      if (puVar2 + 3 < puVar3) {
        uVar5 = uVar5 | (puVar2[3] & 0x7f) << 0xe;
        puVar6 = (uchar *)(ulong)uVar5;
        puVar7 = puVar2 + 4;
        if (-1 < (char)puVar2[3]) goto LAB_001fc1f0;
        if (puVar2 + 4 < puVar3) {
          uVar5 = uVar5 | (puVar2[4] & 0x7f) << 0x15;
          puVar6 = (uchar *)(ulong)uVar5;
          puVar7 = puVar2 + 5;
          if (-1 < (char)puVar2[4]) goto LAB_001fc1f0;
          if (puVar2 + 5 < puVar3) {
            uVar5 = uVar5 | (uint)puVar2[5] << 0x1c;
            puVar7 = (uchar *)0x0;
            if (puVar2[5] < 0x10) {
              puVar7 = puVar2 + 6;
            }
            goto LAB_001fc1f0;
          }
        }
      }
    }
  }
  uVar5 = (uint)puVar6;
  puVar7 = (uchar *)0x0;
LAB_001fc1f0:
  if (puVar7 != (uchar *)0x0) {
    decoder->buf_ = puVar7;
    *(uint *)&(this->super_S2Shape).field_0xc = uVar5;
    bVar4 = s2coding::EncodedS2PointVector::Init(&this->vertices_,decoder);
    if ((bVar4) &&
       ((*(int *)&(this->super_S2Shape).field_0xc < 2 ||
        (bVar4 = s2coding::EncodedUintVector<unsigned_int>::Init
                           (&this->cumulative_vertices_,decoder), bVar4)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EncodedS2LaxPolygonShape::Init(Decoder* decoder) {
  if (decoder->avail() < 1) return false;
  uint8 version = decoder->get8();
  if (version != kCurrentEncodingVersionNumber) return false;

  uint32 num_loops;
  if (!decoder->get_varint32(&num_loops)) return false;
  num_loops_ = num_loops;

  if (!vertices_.Init(decoder)) return false;

  if (num_loops_ > 1) {
    if (!cumulative_vertices_.Init(decoder)) return false;
  }
  return true;
}